

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawpagetexture.cpp
# Opt level: O0

bool CheckIfRaw(FileReader *data)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  size_t size;
  short *block;
  BYTE *foo2;
  int local_30;
  DWORD ofs;
  int x;
  bool gapAtStart;
  int width;
  int height;
  patch_t *foo;
  FileReader *data_local;
  
  lVar3 = FileReader::GetLength(data);
  if (lVar3 == 64000) {
    size = FileReader::GetLength(data);
    block = (short *)M_Malloc_Dbg(size,
                                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/textures/rawpagetexture.cpp"
                                  ,0x52);
    (*(data->super_FileReaderBase)._vptr_FileReaderBase[4])(data,0,0);
    lVar3 = FileReader::GetLength(data);
    (*(data->super_FileReaderBase)._vptr_FileReaderBase[2])(data,block,lVar3);
    iVar2 = (int)*block;
    if ((((block[1] < 1) || (0x1fd < block[1])) || (iVar2 < 1)) || (0x3e7c < iVar2)) {
      M_Free(block);
      data_local._7_1_ = true;
    }
    else {
      bVar1 = true;
      for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
        foo2._4_4_ = *(uint *)(block + (long)local_30 * 2 + 4);
        if (foo2._4_4_ == iVar2 * 4 + 8U) {
          bVar1 = false;
        }
        else {
          if (0xf9fe < foo2._4_4_) {
            free(block);
            return true;
          }
          for (; foo2._4_4_ < 64000;
              foo2._4_4_ = *(byte *)((long)block + (ulong)(foo2._4_4_ + 1)) + 4 + foo2._4_4_) {
            if (*(char *)((long)block + (ulong)foo2._4_4_) == -1) {
              free(block);
              return true;
            }
          }
          if (63999 < foo2._4_4_) {
            free(block);
            return true;
          }
        }
      }
      if ((bVar1) || (local_30 != iVar2)) {
        M_Free(block);
        data_local._7_1_ = true;
      }
      else {
        M_Free(block);
        data_local._7_1_ = false;
      }
    }
  }
  else {
    data_local._7_1_ = false;
  }
  return data_local._7_1_;
}

Assistant:

static bool CheckIfRaw(FileReader & data)
{
	if (data.GetLength() != 64000) return false;

	// This is probably a raw page graphic, but do some checking to be sure
	patch_t *foo;
	int height;
	int width;

	foo = (patch_t *)M_Malloc (data.GetLength());
	data.Seek (0, SEEK_SET);
	data.Read (foo, data.GetLength());

	height = LittleShort(foo->height);
	width = LittleShort(foo->width);

	if (height > 0 && height < 510 && width > 0 && width < 15997)
	{
		// The dimensions seem like they might be valid for a patch, so
		// check the column directory for extra security. At least one
		// column must begin exactly at the end of the column directory,
		// and none of them must point past the end of the patch.
		bool gapAtStart = true;
		int x;

		for (x = 0; x < width; ++x)
		{
			DWORD ofs = LittleLong(foo->columnofs[x]);
			if (ofs == (DWORD)width * 4 + 8)
			{
				gapAtStart = false;
			}
			else if (ofs >= 64000-1)	// Need one byte for an empty column
			{
				free (foo);
				return true;
			}
			else
			{
				// Ensure this column does not extend beyond the end of the patch
				const BYTE *foo2 = (const BYTE *)foo;
				while (ofs < 64000)
				{
					if (foo2[ofs] == 255)
					{
						free (foo);
						return true;
					}
					ofs += foo2[ofs+1] + 4;
				}
				if (ofs >= 64000)
				{
					free (foo);
					return true;
				}
			}
		}
		if (gapAtStart || (x != width))
		{
			M_Free (foo);
			return true;
		}
		M_Free(foo);
		return false;
	}
	else
	{
		M_Free (foo);
		return true;
	}
}